

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O0

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,string *sentence,
          vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words,bool hmm)

{
  bool bVar1;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_RDI;
  Range RVar2;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> wrs;
  Range range;
  PreFilter pre_filter;
  PreFilter *in_stack_fffffffffffffe10;
  PreFilter *in_stack_fffffffffffffe38;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_stack_fffffffffffffe40;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_1b0;
  const_iterator local_198;
  PreFilter *in_stack_fffffffffffffe70;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  undefined1 in_stack_ffffffffffffff17;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_ffffffffffffff18;
  const_iterator in_stack_ffffffffffffff20;
  const_iterator in_stack_ffffffffffffff28;
  QuerySegment *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffffb0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffb8;
  PreFilter *in_stack_ffffffffffffffc0;
  
  PreFilter::PreFilter
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x1ce17c);
  std::__cxx11::string::size();
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
             in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = PreFilter::HasNext(in_stack_fffffffffffffe10);
    if (!bVar1) break;
    RVar2 = PreFilter::Next(in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe10 = (PreFilter *)RVar2.end;
    local_198 = RVar2.begin;
    in_stack_fffffffffffffe38 = in_stack_fffffffffffffe10;
    in_stack_fffffffffffffe70 = in_stack_fffffffffffffe10;
    Cut(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
        in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
  }
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::clear
            ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)0x1ce23f);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size(&local_1b0);
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::reserve
            (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
  GetWordsFromWordRanges
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)in_stack_fffffffffffffe70);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector(in_RDI);
  PreFilter::~PreFilter((PreFilter *)0x1ce293);
  return;
}

Assistant:

void Cut(const string& sentence, vector<Word>& words, bool hmm = true) const {
    PreFilter pre_filter(symbols_, sentence);
    PreFilter::Range range;
    vector<WordRange> wrs;
    wrs.reserve(sentence.size()/2);
    while (pre_filter.HasNext()) {
      range = pre_filter.Next();
      Cut(range.begin, range.end, wrs, hmm);
    }
    words.clear();
    words.reserve(wrs.size());
    GetWordsFromWordRanges(sentence, wrs, words);
  }